

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O2

double enorm(double *x,int N)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)N;
  if (N < 1) {
    uVar3 = uVar2;
  }
  dVar4 = 0.0;
  dVar8 = 0.0;
  dVar6 = 0.0;
  dVar9 = 0.0;
  dVar7 = 0.0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    dVar1 = x[uVar2];
    dVar5 = ABS(dVar1);
    if (1.304e+19 / (double)N <= dVar5) {
      if (dVar5 <= dVar9) {
        dVar4 = dVar4 + (dVar5 / dVar9) * (dVar5 / dVar9);
      }
      else {
        dVar4 = dVar4 * (dVar9 / dVar5) * (dVar9 / dVar5) + 1.0;
        dVar9 = dVar5;
      }
    }
    else if (dVar5 <= 3.834e-20) {
      if (dVar5 <= dVar7) {
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          dVar6 = dVar6 + (dVar5 / dVar7) * (dVar5 / dVar7);
        }
      }
      else {
        dVar6 = dVar6 * (dVar7 / dVar5) * (dVar7 / dVar5) + 1.0;
        dVar7 = dVar5;
      }
    }
    else {
      dVar8 = dVar8 + dVar1 * dVar1;
    }
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar4 = dVar4 + (dVar8 / dVar9) / dVar9;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar9 = dVar9 * dVar4;
  }
  else if ((dVar8 != 0.0) || (NAN(dVar8))) {
    if (dVar7 <= dVar8) {
      dVar9 = (dVar6 * dVar7 * (dVar7 / dVar8) + 1.0) * dVar8;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
    }
    if (dVar8 < dVar7) {
      dVar7 = (dVar6 * dVar7 + dVar8 / dVar7) * dVar7;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
        return dVar7;
      }
      dVar9 = SQRT(dVar7);
    }
  }
  else {
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar9 = dVar7 * dVar6;
  }
  return dVar9;
}

Assistant:

double enorm(double *x, int N) {
	double enrm;
	int i;
    double agiant,floatn,one,rdwarf,rgiant,s1,s2,s3,xabs,x1max,x3max,zero;

	/*
	 * C Translation of Fortran Code
	 * Argonne national laboratory. minpack project. march 1980.
      burton s. garbow, kenneth e. hillstrom, jorge j. more
	 */

    one = 1.0;
    zero = 0.0;
    rdwarf = 3.834e-20;
    rgiant = 1.304e19;
    s1 = s2 = s3 = x1max = x3max = zero;
    floatn = N;
    agiant = rgiant / floatn;

    for(i = 0; i < N;++i) {
    	xabs = fabs(x[i]);
    	if (xabs >= agiant) {
    		//sum for large components
    		if (xabs > x1max) {
    			s1 = one + s1*(x1max/xabs)*(x1max/xabs);
    			x1max = xabs;
    		} else {
    			s1 = s1 + (xabs/x1max)*(xabs/x1max);
    		}
    	} else if (xabs <= rdwarf) {
    		//sum for small components
    		if (xabs > x3max) {
                s3 = one + s3*(x3max/xabs)*(x3max/xabs);
                x3max = xabs;
    		} else {
    			if (xabs != zero) {
    				s3 = s3 + (xabs/x3max)*(xabs/x3max);
    			}
    		}

    	} else {
    		//sum for intermediate components.
    		s2 += xabs*xabs;
    	}
    }

    if (s1 != zero) {
    	enrm = x1max*sqrt(s1+(s2/x1max)/x1max);
    } else {
    	if (s2 != zero) {
    		if (s2 >= x3max) {
    			enrm = sqrt(s2*(one+(x3max/s2)*(x3max*s3)));
    		}
    		if (s2 < x3max) {
    			enrm = sqrt(x3max*((s2/x3max)+(x3max*s3)));
    		}
    	} else {
    		enrm = x3max*sqrt(s3);
    	}
    }

	return enrm;
}